

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::ItemSize(ImVec2 *size,float text_offset_y)

{
  float fVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  ImGuiContext *g;
  uint uVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  ImVec2 IVar12;
  
  pIVar3 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  if (pIVar2->SkipItems == false) {
    fVar1 = (pIVar2->DC).CurrLineSize.y;
    uVar4 = -(uint)(size->y <= fVar1);
    fVar8 = (float)(~uVar4 & (uint)size->y | (uint)fVar1 & uVar4);
    fVar1 = (pIVar2->DC).CurrLineTextBaseOffset;
    uVar4 = -(uint)(text_offset_y <= fVar1);
    fVar7 = (float)(~uVar4 & (uint)text_offset_y | (uint)fVar1 & uVar4);
    fVar6 = (pIVar2->DC).CursorPos.x + size->x;
    (pIVar2->DC).CursorPosPrevLine.x = fVar6;
    fVar1 = (pIVar2->DC).CursorPos.y;
    (pIVar2->DC).CursorPosPrevLine.y = fVar1;
    fVar11 = (pIVar3->Style).ItemSpacing.y;
    IVar12.x = (float)(int)((pIVar2->DC).ColumnsOffset.x + (pIVar2->DC).Indent.x + (pIVar2->Pos).x);
    IVar12.y = (float)(int)(fVar11 + fVar1 + fVar8);
    (pIVar2->DC).CursorPos = IVar12;
    fVar11 = IVar12.y - fVar11;
    IVar12 = (pIVar2->DC).CursorMaxPos;
    fVar9 = IVar12.x;
    fVar10 = IVar12.y;
    uVar4 = -(uint)(fVar6 <= fVar9);
    uVar5 = -(uint)(fVar11 <= fVar10);
    (pIVar2->DC).CursorMaxPos =
         (ImVec2)(CONCAT44(~uVar5 & (uint)fVar11,~uVar4 & (uint)fVar6) |
                 CONCAT44((uint)fVar10 & uVar5,(uint)fVar9 & uVar4));
    (pIVar2->DC).PrevLineSize.y = fVar8;
    (pIVar2->DC).PrevLineTextBaseOffset = fVar7;
    (pIVar2->DC).CurrLineTextBaseOffset = 0.0;
    (pIVar2->DC).CurrLineSize.y = 0.0;
    if ((pIVar2->DC).LayoutType == 0) {
      pIVar2->WriteAccessed = true;
      (pIVar2->DC).CursorPos.x = fVar6 + (pIVar3->Style).ItemSpacing.x;
      (pIVar2->DC).CursorPos.y = fVar1;
      (pIVar2->DC).CurrLineSize = (pIVar2->DC).PrevLineSize;
      (pIVar2->DC).CurrLineTextBaseOffset = fVar7;
      return;
    }
  }
  return;
}

Assistant:

void ImGui::ItemSize(const ImVec2& size, float text_offset_y)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    // Always align ourselves on pixel boundaries
    const float line_height = ImMax(window->DC.CurrLineSize.y, size.y);
    const float text_base_offset = ImMax(window->DC.CurrLineTextBaseOffset, text_offset_y);
    //if (g.IO.KeyAlt) window->DrawList->AddRect(window->DC.CursorPos, window->DC.CursorPos + ImVec2(size.x, line_height), IM_COL32(255,0,0,200)); // [DEBUG]
    window->DC.CursorPosPrevLine.x = window->DC.CursorPos.x + size.x;
    window->DC.CursorPosPrevLine.y = window->DC.CursorPos.y;
    window->DC.CursorPos.x = (float)(int)(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
    window->DC.CursorPos.y = (float)(int)(window->DC.CursorPos.y + line_height + g.Style.ItemSpacing.y);
    window->DC.CursorMaxPos.x = ImMax(window->DC.CursorMaxPos.x, window->DC.CursorPosPrevLine.x);
    window->DC.CursorMaxPos.y = ImMax(window->DC.CursorMaxPos.y, window->DC.CursorPos.y - g.Style.ItemSpacing.y);
    //if (g.IO.KeyAlt) window->DrawList->AddCircle(window->DC.CursorMaxPos, 3.0f, IM_COL32(255,0,0,255), 4); // [DEBUG]

    window->DC.PrevLineSize.y = line_height;
    window->DC.PrevLineTextBaseOffset = text_base_offset;
    window->DC.CurrLineSize.y = window->DC.CurrLineTextBaseOffset = 0.0f;

    // Horizontal layout mode
    if (window->DC.LayoutType == ImGuiLayoutType_Horizontal)
        SameLine();
}